

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
* wallet::GetAddressBalances(CWallet *wallet)

{
  long lVar1;
  bool bVar2;
  isminetype iVar3;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *psVar4;
  const_reference pvVar5;
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  CAmount n;
  value_type *output;
  uint i;
  int nDepth;
  CWalletTx *wtx;
  value_type *walletEntry;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *__range2;
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
  *balances;
  const_iterator __end2;
  const_iterator __begin2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  CTxDestination addr;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> trusted_parents;
  undefined4 in_stack_fffffffffffffe38;
  uint32_t in_stack_fffffffffffffe3c;
  CWalletTx *in_stack_fffffffffffffe40;
  CWallet *in_stack_fffffffffffffe48;
  COutPoint *in_stack_fffffffffffffe50;
  CWallet *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  char *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  uint local_140;
  CTxDestination *in_stack_ffffffffffffff20;
  CScript *in_stack_ffffffffffffff28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
  ::map((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
         *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe78,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
             ,(char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe58 >> 0x18,0));
  ::_GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::begin((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
           *)in_stack_fffffffffffffe40);
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
         *)in_stack_fffffffffffffe40);
  while (bVar2 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                             *)in_stack_fffffffffffffe48,
                            (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                             *)in_stack_fffffffffffffe40), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
    operator*((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    in_stack_fffffffffffffe8f =
         CachedTxIsTrusted((CWallet *)
                           CONCAT17(in_stack_fffffffffffffe8f,
                                    CONCAT16(in_stack_fffffffffffffe8e,
                                             CONCAT24(in_stack_fffffffffffffe8c,
                                                      in_stack_fffffffffffffe88))),
                           (CWalletTx *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe78);
    if (((bool)in_stack_fffffffffffffe8f) &&
       (in_stack_fffffffffffffe8e =
             CWallet::IsTxImmatureCoinBase(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40),
       !(bool)in_stack_fffffffffffffe8e)) {
      in_stack_fffffffffffffe80 =
           CWallet::GetTxDepthInMainChain
                     ((CWallet *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                      (CWalletTx *)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe88 = in_stack_fffffffffffffe80;
      bVar2 = CachedTxIsFromMe(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                               (isminefilter *)
                               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      in_stack_fffffffffffffe84 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe84);
      if ((int)(uint)!bVar2 <= in_stack_fffffffffffffe80) {
        local_140 = 0;
        while( true ) {
          in_stack_fffffffffffffe78 =
               (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)(ulong)local_140;
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          psVar4 = (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                   std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                             ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          if (psVar4 <= in_stack_fffffffffffffe78) break;
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          pvVar5 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                             ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe48,
                              (size_type)in_stack_fffffffffffffe40);
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          iVar3 = CWallet::IsMine(in_stack_fffffffffffffe48,(CTxOut *)in_stack_fffffffffffffe40);
          if ((iVar3 != ISMINE_NO) &&
             (bVar2 = ExtractDestination(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20), bVar2
             )) {
            transaction_identifier<false>::FromUint256
                      ((uint256 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            COutPoint::COutPoint
                      ((COutPoint *)in_stack_fffffffffffffe48,(Txid *)in_stack_fffffffffffffe40,
                       in_stack_fffffffffffffe3c);
            in_stack_fffffffffffffe67 =
                 CWallet::IsSpent(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
            if ((bool)in_stack_fffffffffffffe67) {
              in_stack_fffffffffffffe48 = (CWallet *)0x0;
            }
            else {
              in_stack_fffffffffffffe48 = (CWallet *)pvVar5->nValue;
            }
            in_stack_fffffffffffffe58 = in_stack_fffffffffffffe48;
            in_stack_fffffffffffffe50 =
                 (COutPoint *)
                 std::
                 map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
                 ::operator[]((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                              (key_type *)in_stack_fffffffffffffe48);
            *(long *)(in_stack_fffffffffffffe50->hash).m_wrapped.super_base_blob<256U>.m_data.
                     _M_elems =
                 (long)&(in_stack_fffffffffffffe48->super_WalletStorage)._vptr_WalletStorage +
                 *(long *)(in_stack_fffffffffffffe50->hash).m_wrapped.super_base_blob<256U>.m_data.
                          _M_elems;
          }
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          local_140 = local_140 + 1;
        }
      }
    }
    std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
    operator++((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::map<CTxDestination, CAmount> GetAddressBalances(const CWallet& wallet)
{
    std::map<CTxDestination, CAmount> balances;

    {
        LOCK(wallet.cs_wallet);
        std::set<uint256> trusted_parents;
        for (const auto& walletEntry : wallet.mapWallet)
        {
            const CWalletTx& wtx = walletEntry.second;

            if (!CachedTxIsTrusted(wallet, wtx, trusted_parents))
                continue;

            if (wallet.IsTxImmatureCoinBase(wtx))
                continue;

            int nDepth = wallet.GetTxDepthInMainChain(wtx);
            if (nDepth < (CachedTxIsFromMe(wallet, wtx, ISMINE_ALL) ? 0 : 1))
                continue;

            for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
                const auto& output = wtx.tx->vout[i];
                CTxDestination addr;
                if (!wallet.IsMine(output))
                    continue;
                if(!ExtractDestination(output.scriptPubKey, addr))
                    continue;

                CAmount n = wallet.IsSpent(COutPoint(Txid::FromUint256(walletEntry.first), i)) ? 0 : output.nValue;
                balances[addr] += n;
            }
        }
    }

    return balances;
}